

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool adios2sys::SystemTools::ParseURL
               (string *URL,string *protocol,string *username,string *password,string *hostname,
               string *dataport,string *database,bool decode)

{
  bool bVar1;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_R8;
  string *in_R9;
  string *in_stack_00000008;
  byte in_stack_00000010;
  RegularExpression urlRe;
  string *in_stack_fffffffffffffbc8;
  string *psVar2;
  RegularExpression *in_stack_fffffffffffffbd0;
  RegularExpression *in_stack_fffffffffffffbd8;
  string local_3e0 [32];
  string local_3c0 [64];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  undefined4 local_280;
  string *in_stack_fffffffffffffe58;
  bool local_1;
  
  RegularExpression::RegularExpression(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
  bVar1 = RegularExpression::find(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  if (bVar1) {
    RegularExpression::match_abi_cxx11_
              (in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    std::__cxx11::string::operator=(in_RSI,local_2a0);
    std::__cxx11::string::~string(local_2a0);
    RegularExpression::match_abi_cxx11_
              (in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    std::__cxx11::string::operator=(in_RDX,local_2c0);
    std::__cxx11::string::~string(local_2c0);
    RegularExpression::match_abi_cxx11_
              (in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    std::__cxx11::string::operator=(in_RCX,local_2e0);
    std::__cxx11::string::~string(local_2e0);
    RegularExpression::match_abi_cxx11_
              (in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    std::__cxx11::string::operator=(in_R8,local_300);
    std::__cxx11::string::~string(local_300);
    RegularExpression::match_abi_cxx11_
              (in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    std::__cxx11::string::operator=(in_R9,local_320);
    std::__cxx11::string::~string(local_320);
    RegularExpression::match_abi_cxx11_
              (in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    std::__cxx11::string::operator=(in_stack_00000008,local_340);
    std::__cxx11::string::~string(local_340);
    if ((in_stack_00000010 & 1) != 0) {
      DecodeURL(in_stack_fffffffffffffe58);
      std::__cxx11::string::operator=(in_RDX,local_360);
      std::__cxx11::string::~string(local_360);
      DecodeURL(in_stack_fffffffffffffe58);
      psVar2 = local_380;
      std::__cxx11::string::operator=(in_RCX,psVar2);
      std::__cxx11::string::~string(psVar2);
      DecodeURL(in_stack_fffffffffffffe58);
      in_stack_fffffffffffffbd0 = (RegularExpression *)(local_3c0 + 0x20);
      std::__cxx11::string::operator=(in_R8,(string *)in_stack_fffffffffffffbd0);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffbd0);
      DecodeURL(in_stack_fffffffffffffe58);
      psVar2 = local_3c0;
      std::__cxx11::string::operator=(in_R9,psVar2);
      std::__cxx11::string::~string(psVar2);
      DecodeURL(in_stack_fffffffffffffe58);
      std::__cxx11::string::operator=(in_stack_00000008,local_3e0);
      std::__cxx11::string::~string(local_3e0);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  local_280 = 1;
  RegularExpression::~RegularExpression(in_stack_fffffffffffffbd0);
  return local_1;
}

Assistant:

bool SystemTools::ParseURL(const std::string& URL, std::string& protocol,
                           std::string& username, std::string& password,
                           std::string& hostname, std::string& dataport,
                           std::string& database, bool decode)
{
  kwsys::RegularExpression urlRe(VTK_URL_REGEX);
  if (!urlRe.find(URL))
    return false;

  // match 0 URL
  // match 1 protocol
  // match 2 mangled user
  // match 3 username
  // match 4 mangled password
  // match 5 password
  // match 6 hostname
  // match 7 mangled port
  // match 8 dataport
  // match 9 database name

  protocol = urlRe.match(1);
  username = urlRe.match(3);
  password = urlRe.match(5);
  hostname = urlRe.match(6);
  dataport = urlRe.match(8);
  database = urlRe.match(9);

  if (decode) {
    username = DecodeURL(username);
    password = DecodeURL(password);
    hostname = DecodeURL(hostname);
    dataport = DecodeURL(dataport);
    database = DecodeURL(database);
  }

  return true;
}